

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenaViolation.c
# Opt level: O0

Aig_Man_t *
createNewAigWith0LivePoWithDSC
          (Aig_Man_t *pAig,Vec_Ptr_t *signalList,int *index0Live,int windowBeginIndex,
          int withinWindowIndex,int pendingSignalIndex,Vec_Ptr_t *vBarriers)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Aig_Man_t *p;
  size_t sVar4;
  char *pcVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *pAVar7;
  void *pvVar8;
  Vec_Ptr_t *pVVar9;
  Vec_Ptr_t *p_00;
  Aig_Obj_t *pAVar10;
  Aig_Obj_t *pAVar11;
  Vec_Ptr_t *vBarrierLiDriver_00;
  Vec_Ptr_t *vMonotoneDisjunctionNodes;
  Aig_Obj_t *pAVar12;
  Aig_Obj_t *pAVar13;
  Vec_Ptr_t *pVVar14;
  Aig_Obj_t *pObjCurrMonotoneLo;
  Aig_Obj_t *pObjMonotoneAnd;
  Aig_Obj_t *pObjPendingAndPendingSignal;
  Vec_Ptr_t *vMonotoneBarrierLo;
  Aig_Obj_t *pObjPendingFlopLo;
  Aig_Obj_t *pObjPendingSignal;
  Vec_Ptr_t *vMonotoneNodes;
  Vec_Ptr_t *vBarrierLi;
  Vec_Ptr_t *vBarrierLiDriver;
  Vec_Ptr_t *vBarrierLo;
  Aig_Obj_t *pObjArenaViolationLo;
  Aig_Obj_t *pObjNewPoDriverArenaViolated;
  Aig_Obj_t *pObjArenaViolationLiDriver;
  Aig_Obj_t *pObjTarget;
  Aig_Obj_t *pObjArenaViolation;
  Aig_Obj_t *pObjWithinWindowNew;
  Aig_Obj_t *pObjWindowBeginsNew;
  int local_58;
  int liCreated;
  int liCopied;
  int loCreated;
  int loCopied;
  int i;
  Aig_Obj_t *pObjNewPoDriver;
  Aig_Obj_t *pObj;
  Aig_Man_t *pNewAig;
  int pendingSignalIndex_local;
  int withinWindowIndex_local;
  int windowBeginIndex_local;
  int *index0Live_local;
  Vec_Ptr_t *signalList_local;
  Aig_Man_t *pAig_local;
  
  liCopied = 0;
  local_58 = 0;
  iVar1 = Aig_ManObjNumMax(pAig);
  p = Aig_ManStart(iVar1);
  sVar4 = strlen(pAig->pName);
  pcVar5 = (char *)malloc(sVar4 + 7);
  p->pName = pcVar5;
  sprintf(p->pName,"%s_%s",pAig->pName,"0Live");
  p->pSpec = (char *)0x0;
  pAVar6 = Aig_ManConst1(pAig);
  pAVar7 = Aig_ManConst1(p);
  (pAVar6->field_5).pData = pAVar7;
  for (loCreated = 0; iVar1 = Saig_ManPiNum(pAig), loCreated < iVar1; loCreated = loCreated + 1) {
    pvVar8 = Vec_PtrEntry(pAig->vCis,loCreated);
    pAVar6 = Aig_ObjCreateCi(p);
    *(Aig_Obj_t **)((long)pvVar8 + 0x28) = pAVar6;
  }
  for (loCreated = 0; iVar1 = Saig_ManRegNum(pAig), loCreated < iVar1; loCreated = loCreated + 1) {
    pVVar9 = pAig->vCis;
    iVar1 = Saig_ManPiNum(pAig);
    pvVar8 = Vec_PtrEntry(pVVar9,loCreated + iVar1);
    liCopied = liCopied + 1;
    pAVar6 = Aig_ObjCreateCi(p);
    *(Aig_Obj_t **)((long)pvVar8 + 0x28) = pAVar6;
  }
  pVVar9 = createArenaLO(p,vBarriers);
  iVar1 = Vec_PtrSize(pVVar9);
  pAVar6 = Aig_ObjCreateCi(p);
  pAVar7 = Aig_ObjCreateCi(p);
  p_00 = createMonotoneBarrierLO(p,vBarriers);
  iVar2 = Vec_PtrSize(p_00);
  iVar2 = iVar1 + 2 + iVar2;
  for (loCreated = 0; iVar1 = Vec_PtrSize(pAig->vObjs), loCreated < iVar1; loCreated = loCreated + 1
      ) {
    pAVar10 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,loCreated);
    if ((pAVar10 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar10), iVar1 != 0)) {
      pAVar11 = Aig_ObjChild0Copy(pAVar10);
      pAVar12 = Aig_ObjChild1Copy(pAVar10);
      pAVar11 = Aig_And(p,pAVar11,pAVar12);
      (pAVar10->field_5).pData = pAVar11;
    }
  }
  pAVar10 = Aig_ManCo(pAig,windowBeginIndex);
  pAVar10 = driverToPoNew(pAig,pAVar10);
  pAVar11 = Aig_ManCo(pAig,withinWindowIndex);
  pAVar11 = driverToPoNew(pAig,pAVar11);
  iVar1 = Vec_PtrSize(vBarriers);
  vBarrierLiDriver_00 = Vec_PtrAlloc(iVar1);
  iVar1 = Vec_PtrSize(vBarriers);
  vMonotoneDisjunctionNodes = Vec_PtrAlloc(iVar1);
  pAVar10 = createArenaViolation
                      (pAig,p,pAVar10,pAVar11,vBarriers,pVVar9,vBarrierLiDriver_00,
                       vMonotoneDisjunctionNodes);
  iVar1 = Vec_PtrSize(vMonotoneDisjunctionNodes);
  iVar3 = Vec_PtrSize(vBarriers);
  if (iVar1 != iVar3) {
    __assert_fail("Vec_PtrSize(vMonotoneNodes) == Vec_PtrSize(vBarriers)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/arenaViolation.c"
                  ,0x1aa,
                  "Aig_Man_t *createNewAigWith0LivePoWithDSC(Aig_Man_t *, Vec_Ptr_t *, int *, int, int, int, Vec_Ptr_t *)"
                 );
  }
  pAVar10 = Aig_Or(p,pAVar10,pAVar6);
  pAVar11 = Aig_ManCo(pAig,pendingSignalIndex);
  pAVar11 = driverToPoNew(pAig,pAVar11);
  pAVar7 = Aig_And(p,pAVar11,pAVar7);
  pObjCurrMonotoneLo = Aig_ManConst1(p);
  for (loCreated = 0; iVar1 = Vec_PtrSize(vMonotoneDisjunctionNodes), loCreated < iVar1;
      loCreated = loCreated + 1) {
    pAVar12 = (Aig_Obj_t *)Vec_PtrEntry(vMonotoneDisjunctionNodes,loCreated);
    pAVar13 = (Aig_Obj_t *)Vec_PtrEntry(p_00,loCreated);
    pAVar13 = Aig_And(p,pAVar7,pAVar13);
    pAVar13 = Aig_Not(pAVar13);
    pAVar12 = Aig_Or(p,pAVar13,pAVar12);
    pObjCurrMonotoneLo = Aig_And(p,pObjCurrMonotoneLo,pAVar12);
  }
  for (loCreated = 0; iVar1 = Saig_ManPoNum(pAig), loCreated < iVar1; loCreated = loCreated + 1) {
    pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,loCreated);
    pAVar12 = Aig_ObjChild0Copy(pAVar7);
    pAVar12 = Aig_ObjCreateCo(p,pAVar12);
    (pAVar7->field_5).pData = pAVar12;
  }
  pAVar7 = createConstrained0LiveConeWithDSC(p,signalList);
  pAVar6 = Aig_Or(p,pAVar7,pAVar6);
  pAVar6 = Aig_And(p,pAVar6,pObjCurrMonotoneLo);
  Aig_ObjCreateCo(p,pAVar6);
  *index0Live = loCreated;
  for (loCreated = 0; iVar1 = Saig_ManRegNum(pAig), loCreated < iVar1; loCreated = loCreated + 1) {
    pVVar14 = pAig->vCos;
    iVar1 = Saig_ManPoNum(pAig);
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(pVVar14,loCreated + iVar1);
    local_58 = local_58 + 1;
    pAVar7 = Aig_ObjChild0Copy(pAVar6);
    pAVar7 = Aig_ObjCreateCo(p,pAVar7);
    (pAVar6->field_5).pData = pAVar7;
  }
  iVar1 = Vec_PtrSize(vBarrierLiDriver_00);
  iVar3 = Vec_PtrSize(vBarriers);
  if (iVar1 != iVar3) {
    __assert_fail("Vec_PtrSize(vBarrierLiDriver) == Vec_PtrSize(vBarriers)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/arenaViolation.c"
                  ,0x1e5,
                  "Aig_Man_t *createNewAigWith0LivePoWithDSC(Aig_Man_t *, Vec_Ptr_t *, int *, int, int, int, Vec_Ptr_t *)"
                 );
  }
  pVVar14 = createArenaLi(p,vBarriers,vBarrierLiDriver_00);
  iVar1 = Vec_PtrSize(pVVar14);
  Aig_ObjCreateCo(p,pAVar10);
  Aig_ObjCreateCo(p,pAVar11);
  pObjWindowBeginsNew._4_4_ = iVar1 + 2;
  for (loCreated = 0; iVar1 = Vec_PtrSize(vMonotoneDisjunctionNodes), loCreated < iVar1;
      loCreated = loCreated + 1) {
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(vMonotoneDisjunctionNodes,loCreated);
    Aig_ObjCreateCo(p,pAVar6);
    pObjWindowBeginsNew._4_4_ = pObjWindowBeginsNew._4_4_ + 1;
  }
  if (liCopied + iVar2 == local_58 + pObjWindowBeginsNew._4_4_) {
    Aig_ManSetRegNum(p,liCopied + iVar2);
    Aig_ManCleanup(p);
    iVar1 = Aig_ManCheck(p);
    if (iVar1 != 0) {
      Vec_PtrFree(pVVar9);
      Vec_PtrFree(p_00);
      Vec_PtrFree(vBarrierLiDriver_00);
      Vec_PtrFree(pVVar14);
      Vec_PtrFree(vMonotoneDisjunctionNodes);
      return p;
    }
    __assert_fail("Aig_ManCheck( pNewAig )",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/arenaViolation.c"
                  ,0x206,
                  "Aig_Man_t *createNewAigWith0LivePoWithDSC(Aig_Man_t *, Vec_Ptr_t *, int *, int, int, int, Vec_Ptr_t *)"
                 );
  }
  __assert_fail("loCopied + loCreated == liCopied + liCreated",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/arenaViolation.c"
                ,0x201,
                "Aig_Man_t *createNewAigWith0LivePoWithDSC(Aig_Man_t *, Vec_Ptr_t *, int *, int, int, int, Vec_Ptr_t *)"
               );
}

Assistant:

Aig_Man_t *createNewAigWith0LivePoWithDSC( Aig_Man_t *pAig, Vec_Ptr_t *signalList, int *index0Live, int windowBeginIndex, int withinWindowIndex, int pendingSignalIndex, Vec_Ptr_t *vBarriers )
{
	Aig_Man_t *pNewAig;
	Aig_Obj_t *pObj, *pObjNewPoDriver;
	int i;
	int loCopied = 0, loCreated = 0, liCopied = 0, liCreated = 0;
	Aig_Obj_t *pObjWindowBeginsNew, *pObjWithinWindowNew, *pObjArenaViolation, *pObjTarget, *pObjArenaViolationLiDriver;
	Aig_Obj_t *pObjNewPoDriverArenaViolated, *pObjArenaViolationLo;
	Vec_Ptr_t *vBarrierLo, *vBarrierLiDriver, *vBarrierLi;
	Vec_Ptr_t *vMonotoneNodes;

#ifdef BARRIER_MONOTONE_TEST
	Aig_Obj_t *pObjPendingSignal;
	Aig_Obj_t *pObjPendingFlopLo;
	Vec_Ptr_t *vMonotoneBarrierLo;
	Aig_Obj_t *pObjPendingAndPendingSignal, *pObjMonotoneAnd, *pObjCurrMonotoneLo;
#endif

	//assert( Vec_PtrSize( signalList ) > 1 );

	//****************************************************************
	// Step1: create the new manager
	// Note: The new manager is created with "2 * Aig_ManObjNumMax(p)"
	// nodes, but this selection is arbitrary - need to be justified
	//****************************************************************
	pNewAig = Aig_ManStart( Aig_ManObjNumMax(pAig) );
	pNewAig->pName = (char *)malloc( strlen( pAig->pName ) + strlen("_0Live") + 1 );
	sprintf(pNewAig->pName, "%s_%s", pAig->pName, "0Live");
    	pNewAig->pSpec = NULL;

	//****************************************************************
	// Step 2: map constant nodes
	//****************************************************************
    	pObj = Aig_ManConst1( pAig );
    	pObj->pData = Aig_ManConst1( pNewAig );

	//****************************************************************
    	// Step 3: create true PIs
	//****************************************************************
    	Saig_ManForEachPi( pAig, pObj, i )
	{
		pObj->pData = Aig_ObjCreateCi( pNewAig );
	}

	//****************************************************************
	// Step 4: create register outputs
	//****************************************************************
    	Saig_ManForEachLo( pAig, pObj, i )
    	{
		loCopied++;
		pObj->pData = Aig_ObjCreateCi( pNewAig );
    	}

	//****************************************************************
	// Step 4.a: create register outputs for the barrier flops
	//****************************************************************
	vBarrierLo = createArenaLO( pNewAig, vBarriers );
	loCreated = Vec_PtrSize(vBarrierLo);

	//****************************************************************
	// Step 4.b: create register output for arenaViolationFlop
	//****************************************************************
	pObjArenaViolationLo = Aig_ObjCreateCi( pNewAig );
	loCreated++;

#ifdef BARRIER_MONOTONE_TEST
	//****************************************************************
	// Step 4.c: create register output for pendingFlop
	//****************************************************************
	pObjPendingFlopLo = Aig_ObjCreateCi( pNewAig );
	loCreated++;

	//****************************************************************
	// Step 4.d: create register outputs for the barrier flops
	// for asserting monotonicity
	//****************************************************************
	vMonotoneBarrierLo = createMonotoneBarrierLO( pNewAig, vBarriers );
	loCreated = loCreated + Vec_PtrSize(vMonotoneBarrierLo);
#endif

	//********************************************************************
	// Step 5: create internal nodes
	//********************************************************************
    	Aig_ManForEachNode( pAig, pObj, i )
	{
		pObj->pData = Aig_And( pNewAig, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
	}

	//********************************************************************
	// Step 5.a: create internal nodes corresponding to arenaViolation
	//********************************************************************
	pObjTarget = Aig_ManCo( pAig, windowBeginIndex );
	pObjWindowBeginsNew = driverToPoNew( pAig, pObjTarget );

	pObjTarget = Aig_ManCo( pAig, withinWindowIndex );
	pObjWithinWindowNew = driverToPoNew( pAig, pObjTarget );

	vBarrierLiDriver = Vec_PtrAlloc( Vec_PtrSize(vBarriers) );
	vMonotoneNodes = Vec_PtrAlloc( Vec_PtrSize(vBarriers) );

	pObjArenaViolation = createArenaViolation( pAig, pNewAig, 
				pObjWindowBeginsNew, pObjWithinWindowNew, 
				vBarriers, vBarrierLo, vBarrierLiDriver, vMonotoneNodes ); 
	assert( Vec_PtrSize(vMonotoneNodes) == Vec_PtrSize(vBarriers) );

#ifdef ARENA_VIOLATION_CONSTRAINT

#endif

	pObjArenaViolationLiDriver = Aig_Or( pNewAig, pObjArenaViolation, pObjArenaViolationLo );

#ifdef BARRIER_MONOTONE_TEST
	//********************************************************************
	// Step 5.b: Create internal nodes for monotone testing
	//********************************************************************

	pObjTarget = Aig_ManCo( pAig, pendingSignalIndex );
	pObjPendingSignal = driverToPoNew( pAig, pObjTarget );
	
	pObjPendingAndPendingSignal = Aig_And( pNewAig, pObjPendingSignal, pObjPendingFlopLo );
	pObjMonotoneAnd = Aig_ManConst1( pNewAig );
	Vec_PtrForEachEntry( Aig_Obj_t *, vMonotoneNodes, pObj, i )
	{
		pObjCurrMonotoneLo = (Aig_Obj_t *)Vec_PtrEntry(vMonotoneBarrierLo, i);
		pObjMonotoneAnd = Aig_And( pNewAig, pObjMonotoneAnd,
			Aig_Or( pNewAig, 
			Aig_Not(Aig_And(pNewAig, pObjPendingAndPendingSignal, pObjCurrMonotoneLo)),
			pObj ) );
	}
#endif

	//********************************************************************
	// Step 6: create primary outputs
	//********************************************************************

	Saig_ManForEachPo( pAig, pObj, i )
	{
		pObj->pData = Aig_ObjCreateCo( pNewAig, Aig_ObjChild0Copy(pObj) ); 
	}

	pObjNewPoDriver = createConstrained0LiveConeWithDSC( pNewAig, signalList );
	pObjNewPoDriverArenaViolated = Aig_Or( pNewAig, pObjNewPoDriver, pObjArenaViolationLo );
#ifdef BARRIER_MONOTONE_TEST
	pObjNewPoDriverArenaViolated = Aig_And( pNewAig, pObjNewPoDriverArenaViolated, pObjMonotoneAnd );
#endif
	Aig_ObjCreateCo( pNewAig, pObjNewPoDriverArenaViolated );

	*index0Live = i;

	//********************************************************************
	// Step 7: create register inputs
	//********************************************************************

	Saig_ManForEachLi( pAig, pObj, i )
	{
		liCopied++;
		pObj->pData = Aig_ObjCreateCo( pNewAig, Aig_ObjChild0Copy(pObj) );
	}

	//********************************************************************
	// Step 7.a: create register inputs for barrier flops
	//********************************************************************
	assert( Vec_PtrSize(vBarrierLiDriver) == Vec_PtrSize(vBarriers) );
	vBarrierLi = createArenaLi( pNewAig, vBarriers, vBarrierLiDriver );
	liCreated = Vec_PtrSize( vBarrierLi );

	//********************************************************************
	// Step 7.b: create register inputs for arenaViolation flop
	//********************************************************************
	Aig_ObjCreateCo( pNewAig, pObjArenaViolationLiDriver );
	liCreated++;

#ifdef BARRIER_MONOTONE_TEST
	//****************************************************************
	// Step 7.c: create register input for pendingFlop
	//****************************************************************
	Aig_ObjCreateCo( pNewAig, pObjPendingSignal);
	liCreated++;

	//********************************************************************
	// Step 7.d: create register inputs for the barrier flops
	// for asserting monotonicity
	//********************************************************************
	Vec_PtrForEachEntry( Aig_Obj_t *, vMonotoneNodes, pObj, i )
	{
		Aig_ObjCreateCo( pNewAig, pObj );
		liCreated++;
	}
#endif

	assert(loCopied + loCreated == liCopied + liCreated);
	//next step should be changed
	Aig_ManSetRegNum( pNewAig, loCopied + loCreated );
	Aig_ManCleanup( pNewAig );

	assert( Aig_ManCheck( pNewAig ) );

	Vec_PtrFree(vBarrierLo);
	Vec_PtrFree(vMonotoneBarrierLo);
	Vec_PtrFree(vBarrierLiDriver);
	Vec_PtrFree(vBarrierLi);
	Vec_PtrFree(vMonotoneNodes);

	return pNewAig;
}